

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attached_database.cpp
# Opt level: O2

void __thiscall duckdb::AttachedDatabase::Close(AttachedDatabase *this)

{
  bool bVar1;
  int iVar2;
  pointer pCVar3;
  DatabaseManager *this_00;
  pointer pSVar4;
  string sStack_38;
  
  if (this->is_closed == false) {
    this->is_closed = true;
    if (this->type != SYSTEM_DATABASE) {
      pCVar3 = unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>,_true>::operator->
                         (&this->catalog);
      iVar2 = (*pCVar3->_vptr_Catalog[0x15])(pCVar3);
      if ((char)iVar2 == '\0') {
        this_00 = DatabaseInstance::GetDatabaseManager(this->db);
        pCVar3 = unique_ptr<duckdb::Catalog,_std::default_delete<duckdb::Catalog>,_true>::operator->
                           (&this->catalog);
        (*pCVar3->_vptr_Catalog[0x16])(&sStack_38,pCVar3);
        DatabaseManager::EraseDatabasePath(this_00,&sStack_38);
        ::std::__cxx11::string::~string((string *)&sStack_38);
      }
    }
    bVar1 = Exception::UncaughtException();
    if ((!bVar1) &&
       ((this->storage).
        super_unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>._M_t.
        super___uniq_ptr_impl<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::StorageManager_*,_std::default_delete<duckdb::StorageManager>_>
        .super__Head_base<0UL,_duckdb::StorageManager_*,_false>._M_head_impl !=
        (StorageManager *)0x0)) {
      pSVar4 = unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>,_true>
               ::operator->(&this->storage);
      bVar1 = StorageManager::InMemory(pSVar4);
      if (!bVar1) {
        if ((this->db->config).options.checkpoint_on_shutdown == false) {
          return;
        }
        pSVar4 = unique_ptr<duckdb::StorageManager,_std::default_delete<duckdb::StorageManager>,_true>
                 ::operator->(&this->storage);
        (*pSVar4->_vptr_StorageManager[5])(pSVar4,0,0,0);
      }
      bVar1 = Allocator::SupportsFlush();
      if (bVar1) {
        Allocator::FlushAll();
      }
    }
  }
  return;
}

Assistant:

void AttachedDatabase::Close() {
	D_ASSERT(catalog);
	if (is_closed) {
		return;
	}
	is_closed = true;

	if (!IsSystem() && !catalog->InMemory()) {
		db.GetDatabaseManager().EraseDatabasePath(catalog->GetDBPath());
	}

	if (Exception::UncaughtException()) {
		return;
	}
	if (!storage) {
		return;
	}

	// shutting down: attempt to checkpoint the database
	// but only if we are not cleaning up as part of an exception unwind
	try {
		if (!storage->InMemory()) {
			auto &config = DBConfig::GetConfig(db);
			if (!config.options.checkpoint_on_shutdown) {
				return;
			}
			CheckpointOptions options;
			options.wal_action = CheckpointWALAction::DELETE_WAL;
			storage->CreateCheckpoint(nullptr, options);
		}
	} catch (...) { // NOLINT
	}

	if (Allocator::SupportsFlush()) {
		Allocator::FlushAll();
	}
}